

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardReporter.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::ClipboardReporter::report(ClipboardReporter *this,string *received,string *approved)

{
  bool in_stack_0000011f;
  string *in_stack_00000120;
  string *in_stack_00000128;
  string local_38 [56];
  
  SystemUtils::isWindowsOs();
  getCommandLineFor(in_stack_00000128,in_stack_00000120,in_stack_0000011f);
  copyToClipboard(approved);
  ::std::__cxx11::string::~string(local_38);
  return true;
}

Assistant:

bool ClipboardReporter::report(std::string received, std::string approved) const
    {
        copyToClipboard(
            getCommandLineFor(received, approved, SystemUtils::isWindowsOs()));
        return true;
    }